

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O1

QStringList *
QDirPrivate::splitFilters(QStringList *__return_storage_ptr__,QString *nameFilter,QChar sep)

{
  qsizetype qVar1;
  long in_FS_OFFSET;
  QStringView QVar2;
  iterator __begin1;
  QString local_a0;
  undefined1 local_88 [32];
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QStringTokenizerBase<QStringView,_QChar> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.m_needle.ucs = sep.ucs;
  if (sep.ucs == L'\0') {
    qVar1 = QString::indexOf(nameFilter,(QChar)0x3b,0,CaseSensitive);
    local_48.m_needle.ucs = L';';
    if (qVar1 == -1) {
      qVar1 = QString::indexOf(nameFilter,(QChar)0x20,0,CaseSensitive);
      local_48.m_needle.ucs = L';';
      if (qVar1 != -1) {
        local_48.m_needle.ucs = L' ';
      }
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_48.m_haystack.m_data = (nameFilter->d).ptr;
  local_48.m_haystack.m_size = (nameFilter->d).size;
  local_48.super_QStringTokenizerBaseBase.m_sb.super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
  super_QFlagsStorage<Qt::SplitBehaviorFlags>.i =
       (QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>)0x0;
  local_48.super_QStringTokenizerBaseBase.m_cs = CaseSensitive;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStringTokenizerBase<QStringView,_QChar>::iterator::iterator((iterator *)local_88,&local_48);
  if (local_88[0x18] == true) {
    do {
      QVar2.m_data = (storage_type_conflict *)local_88._16_8_;
      QVar2.m_size = local_88._8_8_;
      QVar2 = QtPrivate::trimmed(QVar2);
      QString::QString(&local_a0,(QChar *)QVar2.m_data,QVar2.m_size);
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,&local_a0);
      QList<QString>::end(__return_storage_ptr__);
      if (&(local_a0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a0.d.d)->super_QArrayData,2,0x10);
        }
      }
      QStringTokenizerBase<QStringView,_QChar>::iterator::advance((iterator *)local_88);
    } while (local_88[0x18] != false);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

inline QStringList QDirPrivate::splitFilters(const QString &nameFilter, QChar sep)
{
    if (sep.isNull())
        sep = getFilterSepChar(nameFilter);
    QStringList ret;
    for (auto e : qTokenize(nameFilter, sep))
        ret.append(e.trimmed().toString());
    return ret;
}